

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::test_case_start(ConsoleReporter *this,TestCaseData *in)

{
  this->hasLoggedCurrentTestStart = false;
  this->tc = in;
  std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::clear
            (&this->subcasesStack);
  this->currentSubcaseLevel = 0;
  return;
}

Assistant:

void test_case_start(const TestCaseData& in) override {
            hasLoggedCurrentTestStart = false;
            tc                        = &in;
            subcasesStack.clear();
            currentSubcaseLevel = 0;
        }